

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmLocalGenerator *pcVar3;
  pointer pcVar4;
  pointer puVar5;
  cmGeneratedFileStream *fout_00;
  string *make;
  int iVar6;
  TargetType TVar7;
  string *path;
  ostream *poVar8;
  string *psVar9;
  cmValue cVar10;
  char *pcVar11;
  pointer puVar12;
  pointer puVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string currentDir;
  string fastTarget;
  string local_c8;
  cmGeneratedFileStream *local_a8;
  cmExtraKateGenerator *local_a0;
  undefined4 local_94;
  string *local_90;
  string *local_88;
  string local_80;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  pcVar1 = lg->Makefile;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_a0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_MAKE_PROGRAM","");
  local_88 = cmMakefile::GetRequiredDefinition(pcVar1,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CMAKE_KATE_MAKE_ARGUMENTS","");
  local_90 = cmMakefile::GetSafeDefinition(pcVar1,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"build\": \"",0xc);
  make = local_88;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(local_88->_M_dataplus)._M_p,local_88->_M_string_length);
  local_a8 = fout;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  psVar9 = local_90;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(local_90->_M_dataplus)._M_p,local_90->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a8,"\t\t\"clean\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_a8,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a8,"\t\t\"quick\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_a8,(make->_M_dataplus)._M_p,make->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  fout_00 = local_a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"targets\":[\n",0xe);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"all","");
  AppendTarget(local_a0,fout_00,&local_c8,make,psVar9,path,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"clean","");
  AppendTarget(local_a0,fout_00,&local_c8,local_88,local_90,path,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_a0->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar13 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pcVar2->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != local_58) {
    do {
      pcVar3 = (puVar13->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((puVar13->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar4 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar4,pcVar4 + psVar9->_M_string_length);
      psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((puVar13->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      local_60 = puVar13;
      if (local_80._M_string_length == psVar9->_M_string_length) {
        if (local_80._M_string_length == 0) {
          local_94 = (undefined4)CONCAT71((int7)((ulong)psVar9 >> 8),1);
        }
        else {
          iVar6 = bcmp(local_80._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                       local_80._M_string_length);
          local_94 = CONCAT31((int3)((uint)iVar6 >> 8),iVar6 == 0);
        }
      }
      else {
        local_94 = 0;
      }
      puVar5 = *(pointer *)
                ((long)&(pcVar3->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      for (puVar12 = *(pointer *)
                      &(pcVar3->GeneratorTargets).
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                       ._M_impl; puVar12 != puVar5; puVar12 = puVar12 + 1) {
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            (puVar12->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           );
        TVar7 = cmGeneratorTarget::GetType
                          ((cmGeneratorTarget *)
                           (puVar12->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          );
        if (TVar7 < UTILITY) {
          AppendTarget(local_a0,local_a8,psVar9,local_88,local_90,&local_80,path);
          local_c8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
          local_c8.field_2._M_allocated_capacity = 5;
          local_c8.field_2._8_8_ = (long)"preinstall/fast" + 10;
          views._M_len = 2;
          views._M_array = (iterator)&local_c8;
          cmCatViews_abi_cxx11_(&local_50,views);
          AppendTarget(local_a0,local_a8,&local_50,local_88,local_90,&local_80,path);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else if (TVar7 == UTILITY) {
          local_c8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
          __str._M_str = "Nightly";
          __str._M_len = 7;
          iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,7,__str
                            );
          if ((iVar6 != 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) {
            local_c8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
            local_c8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
            __str_00._M_str = "Continuous";
            __str_00._M_len = 10;
            iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,10,
                               __str_00);
            if ((iVar6 != 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0))
            {
              local_c8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
              local_c8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
              __str_01._M_str = "Experimental";
              __str_01._M_len = 0xc;
              iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,0xc
                                 ,__str_01);
              if ((iVar6 != 0) ||
                 (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) {
                AppendTarget(local_a0,local_a8,psVar9,local_88,local_90,&local_80,path);
              }
            }
          }
        }
        else if ((TVar7 == GLOBAL_TARGET) && ((char)local_94 != '\0')) {
          iVar6 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar6 == 0) {
            pcVar1 = ((local_60->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"CMAKE_EDIT_COMMAND","");
            cVar10 = cmMakefile::GetDefinition(pcVar1,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((cVar10.Value == (string *)0x0) ||
               (pcVar11 = strstr(((cVar10.Value)->_M_dataplus)._M_p,"ccmake"),
               pcVar11 != (char *)0x0)) goto LAB_0040162b;
          }
          AppendTarget(local_a0,local_a8,psVar9,local_88,local_90,&local_80,path);
        }
LAB_0040162b:
      }
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      puVar13 = local_60 + 1;
    } while (puVar13 != local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a8,"\t] }\n",5);
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}